

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

void ranges::detail::
     introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,ranges::less,ranges::identity>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               long depth_limit,less *pred,identity *proj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference_wrapper<ranges::less> pred_00;
  reference_wrapper<ranges::identity> proj_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int **ppiVar8;
  int *piVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> mid;
  int *local_58;
  reference_wrapper<ranges::less> local_50;
  reference_wrapper<ranges::identity> local_48;
  int *local_40;
  int *local_38;
  
  local_48._M_data = proj;
  local_50._M_data = pred;
  uVar12 = (long)last._M_current - (long)first._M_current >> 2;
  if (0x10 < (long)uVar12) {
    do {
      proj_00._M_data = local_48._M_data;
      pred_00._M_data = local_50._M_data;
      bVar14 = depth_limit == 0;
      depth_limit = depth_limit + -1;
      if (bVar14) {
        make_heap_fn::
        operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<ranges::less>,_std::reference_wrapper<ranges::identity>_>
                  ((make_heap_fn *)&make_heap,first,last,local_50,local_48);
        sort_heap_fn::
        operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<ranges::less>,_std::reference_wrapper<ranges::identity>_>
                  ((sort_heap_fn *)&sort_heap,first,last,pred_00,proj_00);
        return;
      }
      local_58 = first._M_current;
      local_38 = first._M_current + (uVar12 & 0xfffffffffffffffe) * 2;
      local_40 = last._M_current + -1;
      iVar2 = *first._M_current;
      iVar3 = *local_38;
      iVar4 = last._M_current[-1];
      if (iVar2 < iVar3) {
        ppiVar8 = &local_38;
        if (iVar4 <= iVar3) {
          iVar5 = iVar2 - iVar4;
          ppiVar8 = &local_58;
          iVar3 = iVar2;
LAB_00104ac1:
          if (SBORROW4(iVar3,iVar4) != iVar5 < 0) {
            ppiVar8 = &local_40;
          }
        }
      }
      else {
        ppiVar8 = &local_58;
        if (iVar4 <= iVar2) {
          iVar5 = iVar3 - iVar4;
          ppiVar8 = &local_38;
          goto LAB_00104ac1;
        }
      }
      _Var6._M_current = first._M_current;
      _Var7._M_current = last._M_current;
      piVar9 = *ppiVar8;
      while( true ) {
        lVar13 = (-4 - (long)first._M_current) + (long)_Var6._M_current;
        do {
          first_00._M_current = _Var6._M_current;
          iVar2 = *first_00._M_current;
          _Var6._M_current = first_00._M_current + 1;
          lVar13 = lVar13 + 4;
          piVar11 = _Var7._M_current;
        } while (iVar2 < *piVar9);
        do {
          piVar1 = _Var7._M_current + -1;
          _Var7._M_current = _Var7._M_current + -1;
          piVar11 = piVar11 + -1;
        } while (*piVar9 < *piVar1);
        if (_Var7._M_current <= first_00._M_current) break;
        *first_00._M_current = *piVar1;
        *_Var7._M_current = iVar2;
        _Var10._M_current = piVar9;
        if (_Var7._M_current == piVar9) {
          _Var10._M_current = first_00._M_current;
        }
        bVar14 = first_00._M_current == piVar9;
        piVar9 = _Var10._M_current;
        if (bVar14) {
          piVar9 = piVar11;
        }
      }
      local_58 = first_00._M_current;
      introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,ranges::less,ranges::identity>
                (first_00,last,depth_limit,local_50._M_data,local_48._M_data);
      uVar12 = lVar13 >> 2;
      last._M_current = first_00._M_current;
    } while (0x10 < (long)uVar12);
  }
  return;
}

Assistant:

inline void introsort_loop(I first, I last, Size depth_limit, C & pred, P & proj)
        {
            while(last - first > detail::introsort_threshold())
            {
                if(depth_limit == 0)
                    return partial_sort(
                               first, last, last, std::ref(pred), std::ref(proj)),
                           void();
                I cut = detail::unguarded_partition(first, last, pred, proj);
                detail::introsort_loop(cut, last, --depth_limit, pred, proj);
                last = cut;
            }
        }